

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_pronunciation.c
# Opt level: O0

void njd_set_pronunciation(NJD *njd)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  undefined8 *in_RDI;
  int find;
  NJDNode *head_of_kana_filler_sequence;
  int len;
  int pos;
  int j;
  int i;
  char *str;
  NJDNode *node;
  NJDNode *in_stack_ffffffffffffff98;
  NJDNode *in_stack_ffffffffffffffa0;
  NJDNode *in_stack_ffffffffffffffa8;
  NJDNode *in_stack_ffffffffffffffb0;
  NJDNode *local_30;
  int local_24;
  int local_20;
  int local_1c;
  NJDNode *local_10;
  
  for (local_10 = (NJDNode *)*in_RDI; local_10 != (NJDNode *)0x0; local_10 = local_10->next) {
    iVar2 = NJDNode_get_mora_size(local_10);
    if (iVar2 == 0) {
      NJDNode_set_read(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
      NJDNode_set_pron(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
      pcVar3 = NJDNode_get_string(local_10);
      sVar4 = strlen(pcVar3);
      local_24 = 0;
      while (local_24 < (int)sVar4) {
        local_1c = 0;
        local_20 = 0;
        while ((njd_set_pronunciation_list[local_1c] != (char *)0x0 &&
               (local_20 = strtopcmp(pcVar3 + local_24,njd_set_pronunciation_list[local_1c]),
               local_20 < 1))) {
          local_1c = local_1c + 3;
        }
        if (local_20 < 1) {
          local_24 = local_24 + 1;
        }
        else {
          local_24 = local_20 + local_24;
          NJDNode_add_read(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
          NJDNode_add_pron(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
          atoi(njd_set_pronunciation_list[local_1c + 2]);
          NJDNode_add_mora_size
                    (in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        }
      }
      iVar2 = NJDNode_get_mora_size(local_10);
      if (iVar2 != 0) {
        NJDNode_set_pos(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
        NJDNode_set_pos_group1(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
        NJDNode_set_pos_group2(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
        NJDNode_set_pos_group3(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
      }
      pcVar3 = NJDNode_get_orig(local_10);
      iVar2 = strcmp(pcVar3,"*");
      if (iVar2 == 0) {
        NJDNode_set_orig(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
      }
      pcVar3 = NJDNode_get_pron(local_10);
      iVar2 = strcmp(pcVar3,"*");
      if (iVar2 == 0) {
        for (local_1c = 0; njd_set_pronunciation_symbol_list[local_1c] != (char *)0x0;
            local_1c = local_1c + 2) {
          pcVar3 = NJDNode_get_string(local_10);
          iVar2 = strcmp(pcVar3,njd_set_pronunciation_symbol_list[local_1c]);
          if (iVar2 == 0) {
            NJDNode_set_read(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
            NJDNode_set_pron(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
            break;
          }
        }
      }
      pcVar3 = NJDNode_get_pron(local_10);
      iVar2 = strcmp(pcVar3,"*");
      if (iVar2 == 0) {
        NJDNode_set_read(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
        NJDNode_set_pron(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
        NJDNode_set_pos(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
      }
    }
  }
  NJD_remove_silent_node((NJD *)in_stack_ffffffffffffffa0);
  local_30 = (NJDNode *)0x0;
  for (local_10 = (NJDNode *)*in_RDI; local_10 != (NJDNode *)0x0; local_10 = local_10->next) {
    pcVar3 = NJDNode_get_pos(local_10);
    iVar2 = strcmp(pcVar3,anon_var_dwarf_b1847);
    if (iVar2 == 0) {
      bVar1 = false;
      for (local_1c = 0; njd_set_pronunciation_list[local_1c] != (char *)0x0;
          local_1c = local_1c + 3) {
        pcVar3 = NJDNode_get_string(local_10);
        iVar2 = strcmp(pcVar3,njd_set_pronunciation_list[local_1c]);
        if (iVar2 == 0) {
          bVar1 = true;
          if (local_30 == (NJDNode *)0x0) {
            local_30 = local_10;
          }
          else {
            in_stack_ffffffffffffff98 = local_30;
            NJDNode_get_string(local_10);
            NJDNode_add_string(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
            in_stack_ffffffffffffffa0 = local_30;
            NJDNode_get_orig(local_10);
            NJDNode_add_orig(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
            in_stack_ffffffffffffffa8 = local_30;
            NJDNode_get_read(local_10);
            NJDNode_add_read(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
            in_stack_ffffffffffffffb0 = local_30;
            NJDNode_get_pron(local_10);
            NJDNode_add_pron(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
            NJDNode_get_mora_size(local_10);
            NJDNode_add_mora_size
                      (in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
            NJDNode_set_pron(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
          }
          break;
        }
      }
      if (!bVar1) {
        local_30 = (NJDNode *)0x0;
      }
    }
    else {
      local_30 = (NJDNode *)0x0;
    }
  }
  NJD_remove_silent_node((NJD *)in_stack_ffffffffffffffa0);
  local_10 = (NJDNode *)*in_RDI;
  do {
    if (local_10 == (NJDNode *)0x0) {
      return;
    }
    if (local_10->next != (_NJDNode *)0x0) {
      pcVar3 = NJDNode_get_pron(local_10->next);
      iVar2 = strcmp(pcVar3,anon_var_dwarf_1e0e);
      if (iVar2 == 0) {
        pcVar3 = NJDNode_get_pos(local_10->next);
        iVar2 = strcmp(pcVar3,anon_var_dwarf_b6aa0 + 6);
        if (iVar2 == 0) {
          pcVar3 = NJDNode_get_pos(local_10);
          iVar2 = strcmp(pcVar3,anon_var_dwarf_b5858 + 3);
          if (iVar2 != 0) {
            pcVar3 = NJDNode_get_pos(local_10);
            iVar2 = strcmp(pcVar3,anon_var_dwarf_b6aa0 + 6);
            if (iVar2 != 0) goto LAB_00181b35;
          }
          iVar2 = NJDNode_get_mora_size(local_10);
          if (0 < iVar2) {
            NJDNode_set_pron(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
          }
        }
      }
    }
LAB_00181b35:
    if (local_10->next != (_NJDNode *)0x0) {
      pcVar3 = NJDNode_get_pos(local_10);
      iVar2 = strcmp(pcVar3,anon_var_dwarf_b6aa0 + 6);
      if (iVar2 == 0) {
        pcVar3 = NJDNode_get_string(local_10->next);
        iVar2 = strcmp(pcVar3,anon_var_dwarf_14fa);
        if (iVar2 == 0) {
          pcVar3 = NJDNode_get_string(local_10);
          iVar2 = strcmp(pcVar3,anon_var_dwarf_b18e5);
          if (iVar2 == 0) {
            NJDNode_set_pron(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
          }
          else {
            pcVar3 = NJDNode_get_string(local_10);
            iVar2 = strcmp(pcVar3,anon_var_dwarf_b18f9);
            if (iVar2 == 0) {
              NJDNode_set_pron(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
            }
          }
        }
      }
    }
    local_10 = local_10->next;
  } while( true );
}

Assistant:

void njd_set_pronunciation(NJD * njd)
{
   NJDNode *node;
   const char *str;
   int i, j = 0;
   int pos;
   int len;

   for (node = njd->head; node != NULL; node = node->next) {
      if (NJDNode_get_mora_size(node) == 0) {
         NJDNode_set_read(node, NULL);
         NJDNode_set_pron(node, NULL);
         /* if the word is kana, set them as filler */
         {
            str = NJDNode_get_string(node);
            len = strlen(str);
            for (pos = 0; pos < len;) {
               for (i = 0, j = 0; njd_set_pronunciation_list[i] != NULL; i += 3) {
                  j = strtopcmp(&str[pos], njd_set_pronunciation_list[i]);
                  if (j > 0)
                     break;
               }
               if (j > 0) {
                  pos += j;
                  NJDNode_add_read(node, (char *) njd_set_pronunciation_list[i + 1]);
                  NJDNode_add_pron(node, (char *) njd_set_pronunciation_list[i + 1]);
                  NJDNode_add_mora_size(node, atoi(njd_set_pronunciation_list[i + 2]));
               } else {
                  pos++;
               }
            }
            /* if filler, overwrite pos */
            if (NJDNode_get_mora_size(node) != 0) {
               NJDNode_set_pos(node, NJD_SET_PRONUNCIATION_FILLER);
               NJDNode_set_pos_group1(node, NULL);
               NJDNode_set_pos_group2(node, NULL);
               NJDNode_set_pos_group3(node, NULL);
            }
            if (strcmp(NJDNode_get_orig(node), "*") == 0) {
               NJDNode_set_orig(node, str);
            }
         }
         /* if known symbol, set the pronunciation */
         if (strcmp(NJDNode_get_pron(node), "*") == 0) {
            for (i = 0; njd_set_pronunciation_symbol_list[i] != NULL; i += 2) {
               if (strcmp(NJDNode_get_string(node), njd_set_pronunciation_symbol_list[i]) == 0) {
                  NJDNode_set_read(node, (char *) njd_set_pronunciation_symbol_list[i + 1]);
                  NJDNode_set_pron(node, (char *) njd_set_pronunciation_symbol_list[i + 1]);
                  break;
               }
            }
         }
         /* if the word is not kana, set pause symbol */
         if (strcmp(NJDNode_get_pron(node), "*") == 0) {
            NJDNode_set_read(node, NJD_SET_PRONUNCIATION_TOUTEN);
            NJDNode_set_pron(node, NJD_SET_PRONUNCIATION_TOUTEN);
            NJDNode_set_pos(node, NJD_SET_PRONUNCIATION_KIGOU);
         }
      }
   }
   NJD_remove_silent_node(njd);

   /* chain kana sequence */
   {
      NJDNode *head_of_kana_filler_sequence = NULL;
      int find;
      for (node = njd->head; node != NULL; node = node->next) {
         if (strcmp(NJDNode_get_pos(node), NJD_SET_PRONUNCIATION_FILLER) == 0) {
            find = 0;
            for (i = 0; njd_set_pronunciation_list[i] != NULL; i += 3) {
               if (strcmp(NJDNode_get_string(node), njd_set_pronunciation_list[i]) == 0) {
                  find = 1;
                  if (head_of_kana_filler_sequence == NULL) {
                     head_of_kana_filler_sequence = node;
                  } else {
                     NJDNode_add_string(head_of_kana_filler_sequence, NJDNode_get_string(node));
                     NJDNode_add_orig(head_of_kana_filler_sequence, NJDNode_get_orig(node));
                     NJDNode_add_read(head_of_kana_filler_sequence, NJDNode_get_read(node));
                     NJDNode_add_pron(head_of_kana_filler_sequence, NJDNode_get_pron(node));
                     NJDNode_add_mora_size(head_of_kana_filler_sequence,
                                           NJDNode_get_mora_size(node));
                     NJDNode_set_pron(node, NULL);
                  }
                  break;
               }
            }
            if (find == 0) {
               head_of_kana_filler_sequence = NULL;
            }
         } else {
            head_of_kana_filler_sequence = NULL;
         }
      }
   }
   NJD_remove_silent_node(njd);

   for (node = njd->head; node != NULL; node = node->next) {
      if (node->next != NULL
          && strcmp(NJDNode_get_pron(node->next), NJD_SET_PRONUNCIATION_U) == 0
          && strcmp(NJDNode_get_pos(node->next), NJD_SET_PRONUNCIATION_JODOUSHI) == 0
          && (strcmp(NJDNode_get_pos(node), NJD_SET_PRONUNCIATION_DOUSHI) == 0
              || strcmp(NJDNode_get_pos(node), NJD_SET_PRONUNCIATION_JODOUSHI) == 0)
          && NJDNode_get_mora_size(node) > 0) {
         NJDNode_set_pron(node->next, NJD_SET_PRONUNCIATION_CHOUON);
      }
      if (node->next != NULL
          && strcmp(NJDNode_get_pos(node), NJD_SET_PRONUNCIATION_JODOUSHI) == 0
          && strcmp(NJDNode_get_string(node->next), NJD_SET_PRONUNCIATION_QUESTION) == 0) {
         if (strcmp(NJDNode_get_string(node), NJD_SET_PRONUNCIATION_DESU_STR) == 0)
            NJDNode_set_pron(node, NJD_SET_PRONUNCIATION_DESU_PRON);
         else if (strcmp(NJDNode_get_string(node), NJD_SET_PRONUNCIATION_MASU_STR) == 0)
            NJDNode_set_pron(node, NJD_SET_PRONUNCIATION_MASU_PRON);
      }
   }
}